

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calc.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  int iVar1;
  Context<char> context;
  undefined1 local_348 [8];
  _Alloc_hider local_340;
  wchar_t local_330 [4];
  Context<char> local_320;
  
  Centaurus::Context<char>::Context(&local_320,"../grammars/calc.cgr");
  local_348 = (undefined1  [8])&PTR__Identifier_0019ece0;
  local_340._M_p = local_330;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_340,L"INPUT",L"");
  iVar1 = Centaurus::Grammar<char>::get_machine_id(&local_320.m_grammar,(Identifier *)local_348);
  local_320.m_callbacks.
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_start[iVar1] = parse_INPUT;
  local_348 = (undefined1  [8])&PTR__Identifier_0019ece0;
  if (local_340._M_p != local_330) {
    operator_delete(local_340._M_p);
  }
  local_348 = (undefined1  [8])&PTR__Identifier_0019ece0;
  local_340._M_p = local_330;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_340,L"EXPR",L"");
  iVar1 = Centaurus::Grammar<char>::get_machine_id(&local_320.m_grammar,(Identifier *)local_348);
  local_320.m_callbacks.
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_start[iVar1] = parse_EXPR;
  local_348 = (undefined1  [8])&PTR__Identifier_0019ece0;
  if (local_340._M_p != local_330) {
    operator_delete(local_340._M_p);
  }
  local_348 = (undefined1  [8])&PTR__Identifier_0019ece0;
  local_340._M_p = local_330;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_340,L"TERM",L"");
  iVar1 = Centaurus::Grammar<char>::get_machine_id(&local_320.m_grammar,(Identifier *)local_348);
  local_320.m_callbacks.
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_start[iVar1] = parse_TERM;
  local_348 = (undefined1  [8])&PTR__Identifier_0019ece0;
  if (local_340._M_p != local_330) {
    operator_delete(local_340._M_p);
  }
  local_348 = (undefined1  [8])&PTR__Identifier_0019ece0;
  local_340._M_p = local_330;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&local_340,L"FACT",L"");
  iVar1 = Centaurus::Grammar<char>::get_machine_id(&local_320.m_grammar,(Identifier *)local_348);
  local_320.m_callbacks.
  super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
  ._M_impl.super__Vector_impl_data._M_start[iVar1] = parse_FACT;
  local_348 = (undefined1  [8])&PTR__Identifier_0019ece0;
  if (local_340._M_p != local_330) {
    operator_delete(local_340._M_p);
  }
  Centaurus::Context<char>::parse(&local_320,argv[1],1);
  printf("Result = %d\n",(ulong)(uint)result);
  if (local_320.m_callbacks.
      super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_320.m_callbacks.
                    super__Vector_base<void_*(*)(const_Centaurus::SymbolContext<char>_&),_std::allocator<void_*(*)(const_Centaurus::SymbolContext<char>_&)>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_320.m_parser.super_IParser._vptr_IParser = (_func_int **)&PTR__ParserEM64T_0019ed10;
  asmjit::CodeHolder::~CodeHolder(&local_320.m_parser.m_code);
  asmjit::JitRuntime::~JitRuntime(&local_320.m_parser.m_runtime);
  Centaurus::Grammar<char>::~Grammar(&local_320.m_grammar);
  return 0;
}

Assistant:

int main(int argc, const char *argv[])
{
    Context<char> context{"../grammars/calc.cgr"};

    context.attach(L"INPUT", parse_INPUT);
    context.attach(L"EXPR", parse_EXPR);
    context.attach(L"TERM", parse_TERM);
    context.attach(L"FACT", parse_FACT);

    context.parse(argv[1], 1);

    printf("Result = %d\n", result);

    return 0;
}